

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

HighsHashTableEntry<int,_int> *
HighsHashTree<int,int>::findCommonInLeaf<4,2>(InnerLeaf<4> *leaf1,InnerLeaf<2> *leaf2,int hashPos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  unsigned_long uVar8;
  uint uVar9;
  long lVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  
  uVar1 = (leaf1->occupation).occupation;
  uVar2 = (leaf2->occupation).occupation;
  uVar15 = uVar2 & uVar1;
  if (uVar15 != 0) {
    iVar16 = -1;
    iVar17 = -1;
    do {
      uVar5 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar13 = (uint)uVar5;
      bVar7 = (byte)uVar5;
      lVar10 = POPCOUNT(uVar1 >> (bVar7 & 0x3f));
      iVar6 = (int)lVar10;
      iVar14 = iVar6 + iVar17;
      if (uVar13 != ((uint)(leaf1->hashes)._M_elems[iVar14] >> 10 & 0x3f)) {
        puVar11 = (leaf1->hashes)._M_elems + iVar17 + lVar10 + 1;
        do {
          iVar17 = iVar17 + 1;
          uVar8 = *puVar11;
          puVar11 = puVar11 + 1;
        } while (uVar13 != ((uint)uVar8 >> 10 & 0x3f));
        iVar14 = iVar6 + iVar17;
      }
      lVar10 = POPCOUNT(uVar2 >> (bVar7 & 0x3f));
      iVar6 = (int)lVar10;
      uVar9 = iVar16 + iVar6;
      if (uVar13 != ((uint)(leaf2->hashes)._M_elems[(int)uVar9] >> 10 & 0x3f)) {
        puVar11 = (leaf2->hashes)._M_elems + iVar16 + lVar10 + 1;
        do {
          iVar16 = iVar16 + 1;
          uVar8 = *puVar11;
          puVar11 = puVar11 + 1;
        } while (uVar13 != ((uint)uVar8 >> 10 & 0x3f));
        uVar9 = iVar6 + iVar16;
      }
      uVar12 = (ulong)uVar9;
      do {
        uVar3 = (leaf1->hashes)._M_elems[iVar14];
        uVar12 = (ulong)(int)uVar12;
        while (uVar4 = (leaf2->hashes)._M_elems[uVar12], uVar3 <= uVar4) {
          if (uVar4 <= uVar3) {
            if ((leaf1->entries)._M_elems[iVar14].key_ == (leaf2->entries)._M_elems[uVar12].key_) {
              return (leaf1->entries)._M_elems + iVar14;
            }
            if (((iVar14 + 1 == leaf1->size) ||
                (uVar13 != ((uint)(leaf1->hashes)._M_elems[iVar14 + 1] >> 10 & 0x3f))) ||
               ((int)uVar12 - leaf2->size == -1)) goto LAB_00277aa2;
            uVar12 = uVar12 + 1;
            uVar9 = (uint)(leaf2->hashes)._M_elems[(int)uVar12];
            goto LAB_00277a94;
          }
          uVar12 = uVar12 + 1;
          if (((int)uVar12 == leaf2->size) ||
             (uVar13 != ((uint)(leaf2->hashes)._M_elems[(int)uVar12] >> 10 & 0x3f)))
          goto LAB_00277aa2;
        }
        if (iVar14 + 1 == leaf1->size) break;
        uVar9 = (uint)(leaf1->hashes)._M_elems[iVar14 + 1];
LAB_00277a94:
        iVar14 = iVar14 + 1;
      } while (uVar13 == (uVar9 >> 10 & 0x3f));
LAB_00277aa2:
      bVar18 = 1L << (bVar7 & 0x3f) != uVar15;
      uVar15 = uVar15 ^ 1L << (uVar5 & 0x3f);
    } while (bVar18);
  }
  return (HighsHashTableEntry<int,_int> *)0x0;
}

Assistant:

operator uint64_t() const { return occupation; }